

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O1

void __thiscall pbrt::LightHandle::PDF_Le(LightHandle *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  float fVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  undefined8 uVar4;
  ushort uVar5;
  GoniometricLight *this_00;
  PortalImageInfiniteLight *this_01;
  undefined8 uVar6;
  float fVar7;
  Float FVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fStack_4c;
  Tuple2<pbrt::Point2,_float> TStack_48;
  undefined1 auStack_40 [8];
  Tuple2<pbrt::Point2,_float> TStack_38;
  Bounds2f BStack_30;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  uVar3 = (this->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits;
  uVar5 = (ushort)(uVar3 >> 0x30);
  if (4 < uVar3 >> 0x30) {
    if (uVar5 < 7) {
      if (uVar5 == 6) {
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.h"
                 ,0x1f0,"Shouldn\'t be called for area lights");
      }
      SpotLight::PDF_Le((SpotLight *)(uVar3 & 0xffffffffffff),ray,pdfPos,pdfDir);
      return;
    }
    this_01 = (PortalImageInfiniteLight *)(uVar3 & 0xffffffffffff);
    if (uVar3 >> 0x30 != 8) {
      if (uVar5 != 7) {
        fVar14 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
        auVar9 = ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.x);
        auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * fVar14)),auVar9,auVar9);
        auVar10 = ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.z);
        auVar9 = vfmadd213ss_fma(auVar10,auVar10,auVar9);
        if (auVar9._0_4_ < 0.0) {
          fVar14 = sqrtf(auVar9._0_4_);
        }
        else {
          auVar9 = vsqrtss_avx(auVar9,auVar9);
          fVar14 = auVar9._0_4_;
        }
        uVar3._0_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
        uVar3._4_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
        auVar9._0_8_ = uVar3 ^ 0x8000000080000000;
        auVar9._8_4_ = 0x80000000;
        auVar9._12_4_ = 0x80000000;
        auVar24._4_4_ = fVar14;
        auVar24._0_4_ = fVar14;
        auVar24._8_4_ = fVar14;
        auVar24._12_4_ = fVar14;
        auVar9 = vdivps_avx(auVar9,auVar24);
        auStack_40 = (undefined1  [8])vmovlps_avx(auVar9);
        TStack_38.x = -(ray->d).super_Tuple3<pbrt::Vector3,_float>.z / fVar14;
        auVar13._0_8_ =
             PortalImageInfiniteLight::ImageFromRender(this_01,(Vector3f *)auStack_40,&fStack_4c);
        auVar13._8_56_ = extraout_var_00;
        TStack_48 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar13._0_16_);
        if ((fStack_4c != 0.0) || (NAN(fStack_4c))) {
          auVar11._8_4_ = 0x3f800000;
          auVar11._0_8_ = 0x3f8000003f800000;
          auVar11._12_4_ = 0x3f800000;
          auVar9 = vmovlhps_avx(ZEXT816(0) << 0x40,auVar11);
          BStack_30.pMin.super_Tuple2<pbrt::Point2,_float>.x = auVar9._0_4_;
          BStack_30.pMin.super_Tuple2<pbrt::Point2,_float>.y = auVar9._4_4_;
          BStack_30.pMax.super_Tuple2<pbrt::Point2,_float>.x = auVar9._8_4_;
          BStack_30.pMax.super_Tuple2<pbrt::Point2,_float>.y = auVar9._12_4_;
          FVar8 = WindowedPiecewiseConstant2D::PDF
                            (&this_01->distribution,(Point2f *)&TStack_48,&BStack_30);
          *pdfPos = 1.0 / (this_01->sceneRadius * this_01->sceneRadius * 3.1415927);
          *pdfDir = FVar8 / fStack_4c;
        }
        else {
          *pdfDir = 0.0;
          *pdfPos = 0.0;
        }
        return;
      }
      *pdfDir = 0.07957747;
      fVar14 = *(float *)&(this_01->image).channelNames.ptr;
      *pdfPos = 1.0 / (fVar14 * fVar14 * 3.1415927);
      return;
    }
    fVar14 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
    fVar7 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
    fVar1 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * (this_01->super_LightBase).renderFromLight.mInv.
                                                    m[0][1])),ZEXT416((uint)fVar14),
                             ZEXT416((uint)(this_01->super_LightBase).renderFromLight.mInv.m[0][0]))
    ;
    auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar1),
                             ZEXT416((uint)(this_01->super_LightBase).renderFromLight.mInv.m[0][2]))
    ;
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * (this_01->super_LightBase).renderFromLight.mInv
                                                     .m[1][1])),ZEXT416((uint)fVar14),
                              ZEXT416((uint)(this_01->super_LightBase).renderFromLight.mInv.m[1][0])
                             );
    auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar1),
                              ZEXT416((uint)(this_01->super_LightBase).renderFromLight.mInv.m[1][2])
                             );
    auVar9 = vinsertps_avx(auVar9,auVar10,0x1c);
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * (this_01->super_LightBase).renderFromLight.mInv
                                                     .m[2][1])),ZEXT416((uint)fVar14),
                              ZEXT416((uint)(this_01->super_LightBase).renderFromLight.mInv.m[2][0])
                             );
    auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar1),
                              ZEXT416((uint)(this_01->super_LightBase).renderFromLight.mInv.m[2][2])
                             );
    BStack_30.pMax.super_Tuple2<pbrt::Point2,_float>.x = -auVar10._0_4_;
    auVar10._0_8_ = auVar9._0_8_ ^ 0x8000000080000000;
    auVar10._8_4_ = auVar9._8_4_ ^ 0x80000000;
    auVar10._12_4_ = auVar9._12_4_ ^ 0x80000000;
    uVar6 = vmovlps_avx(auVar10);
    BStack_30.pMin.super_Tuple2<pbrt::Point2,_float>.x = (float)uVar6;
    BStack_30.pMin.super_Tuple2<pbrt::Point2,_float>.y = (float)((ulong)uVar6 >> 0x20);
    auStack_40._0_4_ = 4.708517e-39;
    auStack_40._4_4_ = 0.0;
    auVar12._0_8_ = EqualAreaSphereToSquare((Vector3f *)&BStack_30);
    auVar12._8_56_ = extraout_var;
    TStack_38 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar12._0_16_);
    auStack_40._0_4_ = 4.708538e-39;
    auStack_40._4_4_ = 0.0;
    FVar8 = PiecewiseConstant2D::PDF
                      ((PiecewiseConstant2D *)
                       &(this_01->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.y,
                       (Point2f *)&TStack_38);
    *pdfDir = FVar8 / 12.566371;
    fVar14 = (this_01->portalFrame).y.super_Tuple3<pbrt::Vector3,_float>.z;
    *pdfPos = 1.0 / (fVar14 * fVar14 * 3.1415927);
    return;
  }
  if (uVar5 < 3) {
    if (uVar5 != 2) {
      *pdfPos = 0.0;
      *pdfDir = 0.07957747;
      return;
    }
    fVar14 = *(float *)((uVar3 & 0xffffffffffff) + 0xd0);
    *pdfPos = 1.0 / (fVar14 * fVar14 * 3.1415927);
    *pdfDir = 0.0;
    return;
  }
  this_00 = (GoniometricLight *)(uVar3 & 0xffffffffffff);
  if (uVar5 == 3) {
    *pdfPos = 0.0;
    fVar14 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
    fVar7 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
    fVar1 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * (this_00->super_LightBase).renderFromLight.mInv.
                                                    m[0][1])),ZEXT416((uint)fVar14),
                             ZEXT416((uint)(this_00->super_LightBase).renderFromLight.mInv.m[0][0]))
    ;
    auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar1),
                             ZEXT416((uint)(this_00->super_LightBase).renderFromLight.mInv.m[0][2]))
    ;
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * (this_00->super_LightBase).renderFromLight.mInv
                                                     .m[1][1])),ZEXT416((uint)fVar14),
                              ZEXT416((uint)(this_00->super_LightBase).renderFromLight.mInv.m[1][0])
                             );
    auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar1),
                              ZEXT416((uint)(this_00->super_LightBase).renderFromLight.mInv.m[1][2])
                             );
    auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * (this_00->super_LightBase).renderFromLight.mInv
                                                     .m[2][1])),ZEXT416((uint)fVar14),
                              ZEXT416((uint)(this_00->super_LightBase).renderFromLight.mInv.m[2][0])
                             );
    auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)fVar1),
                              ZEXT416((uint)(this_00->super_LightBase).renderFromLight.mInv.m[2][2])
                             );
    fVar14 = auVar10._0_4_;
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * fVar14)),auVar9,auVar9);
    auVar10 = vfmadd231ss_fma(auVar10,auVar24,auVar24);
    if (auVar10._0_4_ < 0.0) {
      BStack_30.pMax.super_Tuple2<pbrt::Point2,_float>.x = auVar9._0_4_;
      BStack_30.pMin.super_Tuple2<pbrt::Point2,_float>.x = auVar24._0_4_;
      auStack_40._0_4_ = 4.672494e-39;
      auStack_40._4_4_ = 0.0;
      BStack_30.pMin.super_Tuple2<pbrt::Point2,_float>.y = fVar14;
      fVar7 = sqrtf(auVar10._0_4_);
      auVar24 = ZEXT416((uint)BStack_30.pMin.super_Tuple2<pbrt::Point2,_float>.x);
      auVar9 = ZEXT416((uint)BStack_30.pMax.super_Tuple2<pbrt::Point2,_float>.x);
      fVar14 = BStack_30.pMin.super_Tuple2<pbrt::Point2,_float>.y;
    }
    else {
      auVar10 = vsqrtss_avx(auVar10,auVar10);
      fVar7 = auVar10._0_4_;
    }
    auVar25._0_4_ = auVar24._0_4_ / fVar7;
    auVar25._4_12_ = auVar24._4_12_;
    if (*(float *)((long)&(this_00->image).p32.ptr + 4) <= auVar25._0_4_) {
      fVar14 = fVar14 / fVar7;
      auVar18._0_4_ = auVar9._0_4_ / fVar7;
      auVar18._4_12_ = auVar9._4_12_;
      auVar9 = *(undefined1 (*) [16])((long)&(this_00->image).p16.nStored + 4);
      auVar2._0_8_ = (this_00->image).p32.nAlloc;
      auVar2._8_8_ = (this_00->image).p32.nStored;
      auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * *(float *)((long)&(this_00->distrib).
                                                                          pConditionalY.alloc.
                                                                          memoryResource + 4))),
                                auVar18,ZEXT416(*(uint *)&(this_00->distrib).pConditionalY.alloc.
                                                          memoryResource));
      auVar10 = vfmadd231ss_fma(auVar10,auVar25,
                                ZEXT416(*(uint *)&(this_00->distrib).pConditionalY.ptr));
      fVar7 = auVar10._0_4_ + *(float *)((long)&(this_00->distrib).pConditionalY.ptr + 4);
      auVar10 = vinsertps_avx(*(undefined1 (*) [16])((long)&(this_00->image).p32.nAlloc + 4),
                              ZEXT416(*(uint *)((long)&this_00->imageColorSpace + 4)),0x10);
      auVar15._0_4_ = fVar14 * auVar10._0_4_;
      auVar15._4_4_ = fVar14 * auVar10._4_4_;
      auVar15._8_4_ = fVar14 * auVar10._8_4_;
      auVar15._12_4_ = fVar14 * auVar10._12_4_;
      auVar10 = vinsertps_avx(auVar2,ZEXT416(*(uint *)&this_00->imageColorSpace),0x10);
      auVar19._4_4_ = auVar18._0_4_;
      auVar19._0_4_ = auVar18._0_4_;
      auVar19._8_4_ = auVar18._0_4_;
      auVar19._12_4_ = auVar18._0_4_;
      auVar11 = vfmadd213ps_fma(auVar19,auVar10,auVar15);
      auVar10 = vinsertps_avx(*(undefined1 (*) [16])&(this_00->image).p32.nStored,
                              ZEXT416((this_00->wrapMode).wrap.values[0]),0x10);
      auVar23._4_4_ = auVar25._0_4_;
      auVar23._0_4_ = auVar25._0_4_;
      auVar23._8_4_ = auVar25._0_4_;
      auVar23._12_4_ = auVar25._0_4_;
      auVar11 = vfmadd213ps_fma(auVar23,auVar10,auVar11);
      auVar10 = vinsertps_avx(*(undefined1 (*) [16])((long)&(this_00->image).p32.nStored + 4),
                              ZEXT416((this_00->wrapMode).wrap.values[1]),0x10);
      auVar20._0_4_ = auVar10._0_4_ + auVar11._0_4_;
      auVar20._4_4_ = auVar10._4_4_ + auVar11._4_4_;
      auVar20._8_4_ = auVar10._8_4_ + auVar11._8_4_;
      auVar20._12_4_ = auVar10._12_4_ + auVar11._12_4_;
      auVar16._4_4_ = fVar7;
      auVar16._0_4_ = fVar7;
      auVar16._8_4_ = fVar7;
      auVar16._12_4_ = fVar7;
      auVar10 = vdivps_avx(auVar20,auVar16);
      if ((fVar7 == 1.0) && (!NAN(fVar7))) {
        auVar10 = auVar20;
      }
      auVar21._8_8_ = auVar10._0_8_;
      auVar21._0_8_ = auVar10._0_8_;
      uVar6 = vcmpps_avx512vl(auVar21,auVar9,2);
      uVar4 = vcmpps_avx512vl(auVar9,auVar21,2);
      auVar9 = vpmovm2d_avx512vl(uVar6);
      auVar11 = vpmovm2d_avx512vl(uVar4);
      auVar9 = vpblendd_avx2(auVar11,auVar9,0xc);
      uVar6 = vpmovd2m_avx512vl(auVar9);
      if ((~(ushort)uVar6 & 0xf) == 0) {
        vmovlps_avx(auVar10);
        BStack_30.pMax.super_Tuple2<pbrt::Point2,_float>.y = auVar24._4_4_;
        auStack_40._0_4_ = 4.672948e-39;
        auStack_40._4_4_ = 0.0;
        BStack_30.pMax.super_Tuple2<pbrt::Point2,_float>.x = auVar25._0_4_;
        FVar8 = PiecewiseConstant2D::PDF
                          ((PiecewiseConstant2D *)
                           (this_00[1].super_LightBase.renderFromLight.mInv.m + 1),
                           (Point2f *)&stack0xffffffffffffffe8);
        auVar17._8_8_ = 0;
        auVar17._0_8_ = *(ulong *)((long)&(this_00->image).p16.nStored + 4);
        auVar22._8_8_ = 0;
        auVar22._0_8_ = *(ulong *)((long)&(this_00->image).p32.alloc.memoryResource + 4);
        auVar10 = vsubps_avx(auVar22,auVar17);
        auVar9 = vmovshdup_avx(auVar10);
        *pdfDir = (FVar8 * auVar10._0_4_ * auVar9._0_4_) /
                  (BStack_30.pMax.super_Tuple2<pbrt::Point2,_float>.x *
                   BStack_30.pMax.super_Tuple2<pbrt::Point2,_float>.x *
                   BStack_30.pMax.super_Tuple2<pbrt::Point2,_float>.x *
                  this_00[1].super_LightBase.renderFromLight.mInv.m[0][2]);
        return;
      }
    }
    *pdfDir = 0.0;
    return;
  }
  GoniometricLight::PDF_Le(this_00,ray,pdfPos,pdfDir);
  return;
}

Assistant:

PBRT_CPU_GPU
    TaggedPointer(const TaggedPointer &t) { bits = t.bits; }